

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *this_00;
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  reference pbVar5;
  ostream *poVar6;
  void *this_01;
  char *pcVar7;
  bool collapse;
  string local_1278 [32];
  ostringstream local_1258 [8];
  ostringstream cmCTestLog_msg_8;
  string local_10e0 [32];
  undefined1 local_10c0 [8];
  ostringstream cmCTestLog_msg_7;
  string local_f48 [32];
  undefined1 local_f28 [8];
  ostringstream cmCTestLog_msg_6;
  string local_db0 [32];
  string local_d90 [36];
  int local_d6c;
  undefined1 local_d68 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_bf0 [8];
  ostringstream indexStr;
  string local_a78 [32];
  undefined1 local_a58 [8];
  ostringstream cmCTestLog_msg_4;
  string local_8e0 [32];
  undefined1 local_8c0 [8];
  ostringstream cmCTestLog_msg_3;
  string local_748 [32];
  ostringstream local_728 [8];
  ostringstream cmCTestLog_msg_2;
  string local_5b0 [32];
  undefined1 local_590 [8];
  ostringstream cmCTestLog_msg_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_418;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  iterator label;
  undefined1 local_3e8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_270 [8];
  cmCTestRunTest testRun;
  undefined1 local_50 [8];
  string current_dir;
  cmCTestTestProperties *p;
  _Self local_20;
  iterator it;
  int count;
  cmCTestMultiProcessHandler *this_local;
  
  this_00 = this->TestHandler;
  iVar3 = FindMaxIndex(this);
  cmCTestTestHandler::SetMaxIndex(this_00,iVar3);
  it._M_node._4_4_ = 0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ::begin(&(this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              );
  while( true ) {
    p = (cmCTestTestProperties *)
        std::
        map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
        ::end(&(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             );
    bVar2 = std::operator!=(&local_20,(_Self *)&p);
    if (!bVar2) break;
    it._M_node._4_4_ = it._M_node._4_4_ + 1;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator->(&local_20);
    current_dir.field_2._8_8_ = ppVar4->second;
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_50,(SystemTools *)0x1,collapse);
    cmsys::SystemTools::ChangeDirectory((string *)(current_dir.field_2._8_8_ + 0x20));
    cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_270,this->TestHandler);
    cmCTestRunTest::SetIndex
              ((cmCTestRunTest *)local_270,*(int *)(current_dir.field_2._8_8_ + 0x134));
    cmCTestRunTest::SetTestProperties
              ((cmCTestRunTest *)local_270,(cmCTestTestProperties *)current_dir.field_2._8_8_);
    cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_270);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(current_dir.field_2._8_8_ + 0x158));
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
      std::operator<<((ostream *)local_3e8,"Labels:");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x317,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string((string *)&label);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
    }
    local_410._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(current_dir.field_2._8_8_ + 0x158));
    while( true ) {
      local_418._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(current_dir.field_2._8_8_ + 0x158));
      bVar2 = __gnu_cxx::operator!=(&local_410,&local_418);
      if (!bVar2) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
      poVar6 = std::operator<<((ostream *)local_590," ");
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_410);
      std::operator<<(poVar6,(string *)pbVar5);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x31d,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_5b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_410);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(current_dir.field_2._8_8_ + 0x158));
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_728);
      std::ostream::operator<<(local_728,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x322,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_748);
      std::__cxx11::ostringstream::~ostringstream(local_728);
    }
    if ((this->TestHandler->MemCheck & 1U) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a58);
      std::operator<<((ostream *)local_a58,"  Test");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x32c,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_a78);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a58);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c0);
      std::operator<<((ostream *)local_8c0,"  Memory Check");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x328,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_8e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bf0);
    poVar6 = std::operator<<((ostream *)local_bf0," #");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)(current_dir.field_2._8_8_ + 0x134))
    ;
    std::operator<<(poVar6,":");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d68);
    iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
    iVar3 = getNumWidth((long)iVar3);
    local_d6c = (int)std::setw(iVar3 + 3);
    poVar6 = std::operator<<((ostream *)local_d68,(_Setw)local_d6c);
    std::__cxx11::ostringstream::str();
    std::operator<<(poVar6,local_d90);
    std::__cxx11::string::~string(local_d90);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x332,pcVar7,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_db0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d68);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f28);
    std::operator<<((ostream *)local_f28," ");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x333,pcVar7,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_f48);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f28);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10c0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    poVar6 = std::operator<<((ostream *)local_10c0,pcVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x335,pcVar7,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_10e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10c0);
    cmsys::SystemTools::ChangeDirectory((string *)local_50);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bf0);
    cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_270);
    std::__cxx11::string::~string((string *)local_50);
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&local_20);
  }
  std::__cxx11::ostringstream::ostringstream(local_1258);
  poVar6 = (ostream *)std::ostream::operator<<(local_1258,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,"Total Tests: ");
  this_01 = (void *)std::ostream::operator<<(poVar6,this->Total);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x33b,pcVar7,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string(local_1278);
  std::__cxx11::ostringstream::~ostringstream(local_1258);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  int count = 0;

  for (PropertiesMap::iterator it = this->Properties.begin();
       it != this->Properties.end(); ++it)
    {
    count++;
    cmCTestTestHandler::cmCTestTestProperties& p = *it->second;

    //push working dir
    std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
    cmSystemTools::ChangeDirectory(p.Directory);

    cmCTestRunTest testRun(this->TestHandler);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); //logs the command in verbose mode

    if(!p.Labels.empty()) //print the labels
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Labels:",
        this->Quiet);
      }
    for(std::vector<std::string>::iterator label = p.Labels.begin();
        label != p.Labels.end(); ++label)
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << *label,
        this->Quiet);
      }
    if(!p.Labels.empty()) //print the labels
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
        this->Quiet);
      }

    if (this->TestHandler->MemCheck)
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
        this->Quiet);
      }
     else
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
      }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
      << indexStr.str(), this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " ", this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
      p.Name.c_str() << std::endl, this->Quiet);
    //pop working dir
    cmSystemTools::ChangeDirectory(current_dir);
    }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl << "Total Tests: "
    << this->Total << std::endl, this->Quiet);
}